

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O1

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseCleared<google::protobuf::RepeatedPtrField<std::__cxx11::string>::TypeHandler>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  Rep *pRVar2;
  LogMessage *pLVar3;
  LogFinisher local_101;
  LogMessage local_100;
  LogMessage local_c8;
  LogMessage local_90;
  LogMessage local_58;
  
  if (this->arena_ != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_58,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4c1);
    pLVar3 = LogMessage::operator<<(&local_58,"CHECK failed: GetArena() == nullptr: ");
    pLVar3 = LogMessage::operator<<
                       (pLVar3,"ReleaseCleared() can only be used on a RepeatedPtrField not on ");
    pLVar3 = LogMessage::operator<<(pLVar3,"an arena.");
    LogFinisher::operator=((LogFinisher *)&local_90,pLVar3);
    LogMessage::~LogMessage(&local_58);
  }
  if (this->arena_ != (Arena *)0x0) {
    LogMessage::LogMessage
              (&local_90,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4c4);
    pLVar3 = LogMessage::operator<<(&local_90,"CHECK failed: GetArena() == nullptr: ");
    LogFinisher::operator=((LogFinisher *)&local_c8,pLVar3);
    LogMessage::~LogMessage(&local_90);
  }
  if (this->rep_ == (Rep *)0x0) {
    LogMessage::LogMessage
              (&local_c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4c5);
    pLVar3 = LogMessage::operator<<(&local_c8,"CHECK failed: rep_ != nullptr: ");
    LogFinisher::operator=((LogFinisher *)&local_100,pLVar3);
    LogMessage::~LogMessage(&local_c8);
  }
  if (this->rep_->allocated_size <= this->current_size_) {
    LogMessage::LogMessage
              (&local_100,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/repeated_ptr_field.h"
               ,0x4c6);
    pLVar3 = LogMessage::operator<<
                       (&local_100,"CHECK failed: (rep_->allocated_size) > (current_size_): ");
    LogFinisher::operator=(&local_101,pLVar3);
    LogMessage::~LogMessage(&local_100);
  }
  pRVar2 = this->rep_;
  iVar1 = pRVar2->allocated_size;
  pRVar2->allocated_size = iVar1 + -1;
  return (Type *)pRVar2->elements[(long)iVar1 + -1];
}

Assistant:

inline typename TypeHandler::Type* RepeatedPtrFieldBase::ReleaseCleared() {
  GOOGLE_DCHECK(GetArena() == nullptr)
      << "ReleaseCleared() can only be used on a RepeatedPtrField not on "
      << "an arena.";
  GOOGLE_DCHECK(GetArena() == nullptr);
  GOOGLE_DCHECK(rep_ != nullptr);
  GOOGLE_DCHECK_GT(rep_->allocated_size, current_size_);
  return cast<TypeHandler>(rep_->elements[--rep_->allocated_size]);
}